

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O0

GMM_STATUS __thiscall
GmmLib::GmmTextureCalc::GetTexStdLayoutOffset
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,GMM_REQ_OFFSET_INFO *pReqInfo)

{
  GMM_GFX_SIZE_T GVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  GMM_PLATFORM_INFO *pGVar7;
  undefined4 extraout_var;
  uint local_c8;
  uint local_c4;
  ulong local_c0;
  uint32_t local_b8;
  uint32_t local_b4;
  uint32_t DepthPitch;
  uint32_t RowPitch;
  uint32_t MipDepthTiles;
  uint32_t MipRows;
  uint32_t MipCols;
  uint32_t MipDepth;
  uint32_t MipHeight;
  GMM_GFX_SIZE_T MipWidth;
  uint32_t EffectiveMaxLod;
  uint32_t Lod;
  GMM_GFX_SIZE_T SlicePitch;
  GMM_GFX_SIZE_T SliceOffset;
  GMM_GFX_SIZE_T PrevMipSize;
  GMM_GFX_ADDRESS TargetLodOffset;
  anon_struct_12_3_eb34d150 Tile;
  anon_struct_12_3_eb34d150 Element;
  GMM_TILE_MODE TileMode;
  uint32_t BytesPerElement;
  GMM_PLATFORM_INFO *pPlatform;
  uint32_t TileSize;
  bool NeedSurfaceSize;
  uint32_t ReqArrayIndex;
  GMM_REQ_OFFSET_INFO *pReqInfo_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmTextureCalc *this_local;
  
  bVar2 = false;
  if ((pReqInfo->StdLayout).Offset == 0xffffffffffffffff) {
    bVar2 = true;
    iVar5 = 1;
    if (pTexInfo->Type == RESOURCE_CUBE) {
      iVar5 = 6;
    }
    TileSize = pTexInfo->ArraySize * iVar5;
  }
  else {
    iVar5 = 1;
    if (pTexInfo->Type == RESOURCE_CUBE) {
      iVar5 = 6;
    }
    TileSize = pReqInfo->ArrayIndex * iVar5;
  }
  pPlatform._4_4_ = 0;
  if ((((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) == 0) &&
     (((ulong)(pTexInfo->Flags).Info >> 0x2c & 1) == 0)) {
    if ((((ulong)(pTexInfo->Flags).Info >> 0x24 & 1) != 0) ||
       (((ulong)(pTexInfo->Flags).Info >> 0x2b & 1) != 0)) {
      pPlatform._4_4_ = 0x1000;
    }
  }
  else {
    pPlatform._4_4_ = 0x10000;
  }
  pGVar7 = GmmGetPlatformInfo(this->pGmmLibContext);
  Element.Depth = pTexInfo->BitsPerPixel >> 3;
  Element.Height = pTexInfo->TileMode;
  GetCompressionBlockDimensions(this,pTexInfo->Format,&Tile.Height,&Tile.Depth,&Element.Width);
  uVar3 = (pGVar7->TileInfo[Element.Height].LogicalTileWidth / Element.Depth) * Tile.Height;
  uVar4 = pGVar7->TileInfo[Element.Height].LogicalTileHeight * Tile.Depth;
  Tile.Width = pGVar7->TileInfo[Element.Height].LogicalTileDepth * Element.Width;
  PrevMipSize = 0;
  SliceOffset = 0;
  SlicePitch = 0;
  _EffectiveMaxLod = 0;
  if (TileSize == 0) {
    local_b4 = pReqInfo->MipLevel;
  }
  else {
    if (pTexInfo->MaxLod < (pTexInfo->Alignment).MipTailStartLod) {
      local_b8 = pTexInfo->MaxLod;
    }
    else {
      local_b8 = (pTexInfo->Alignment).MipTailStartLod;
    }
    local_b4 = local_b8;
  }
  (pReqInfo->StdLayout).Offset = 0;
  for (MipWidth._4_4_ = 0; MipWidth._4_4_ <= local_b4; MipWidth._4_4_ = MipWidth._4_4_ + 1) {
    iVar5 = (*this->_vptr_GmmTextureCalc[0x18])(this,pTexInfo,(ulong)MipWidth._4_4_);
    local_c0 = CONCAT44(extraout_var,iVar5);
    local_c4 = (*this->_vptr_GmmTextureCalc[0x19])(this,pTexInfo,(ulong)MipWidth._4_4_);
    local_c8 = (*this->_vptr_GmmTextureCalc[0x1a])(this,pTexInfo,(ulong)MipWidth._4_4_);
    if (uVar3 != 0) {
      local_c0 = (local_c0 + (uVar3 - 1)) / (ulong)uVar3;
    }
    if (uVar4 != 0) {
      local_c4 = (local_c4 + (uVar4 - 1)) / uVar4;
    }
    if (Tile.Width != 0) {
      local_c8 = (local_c8 + (Tile.Width - 1)) / Tile.Width;
    }
    uVar6 = (int)local_c0 * pPlatform._4_4_;
    local_c4 = uVar6 * local_c4;
    if (MipWidth._4_4_ <= (pTexInfo->Alignment).MipTailStartLod) {
      (pReqInfo->StdLayout).Offset = SliceOffset + (pReqInfo->StdLayout).Offset;
    }
    if (MipWidth._4_4_ == pReqInfo->MipLevel) {
      PrevMipSize = (pReqInfo->StdLayout).Offset;
      (pReqInfo->StdLayout).TileRowPitch = (ulong)uVar6;
      (pReqInfo->StdLayout).TileDepthPitch = (ulong)local_c4;
    }
    SliceOffset = (ulong)local_c4 * (ulong)local_c8;
    _EffectiveMaxLod = (ulong)local_c4 + _EffectiveMaxLod;
  }
  if (pReqInfo->Slice != 0) {
    SlicePitch = _EffectiveMaxLod * (ulong)pReqInfo->Slice;
  }
  if ((bVar2) || (pReqInfo->MipLevel < (pTexInfo->Alignment).MipTailStartLod)) {
    (pReqInfo->StdLayout).Offset =
         (ulong)TileSize * ((pReqInfo->StdLayout).Offset + SliceOffset) + PrevMipSize;
  }
  else {
    GVar1 = (pReqInfo->StdLayout).Offset;
    uVar3 = (*this->_vptr_GmmTextureCalc[9])(this,pTexInfo,(ulong)pReqInfo->MipLevel);
    (pReqInfo->StdLayout).Offset =
         (ulong)TileSize * (GVar1 + SliceOffset) + (ulong)uVar3 + (pReqInfo->StdLayout).Offset;
  }
  (pReqInfo->StdLayout).Offset = SlicePitch + (pReqInfo->StdLayout).Offset;
  return GMM_SUCCESS;
}

Assistant:

GMM_STATUS GmmLib::GmmTextureCalc::GetTexStdLayoutOffset(GMM_TEXTURE_INFO *   pTexInfo,
                                                         GMM_REQ_OFFSET_INFO *pReqInfo)
{
    uint32_t ReqArrayIndex;
    bool     NeedSurfaceSize = false;

    __GMM_ASSERT(pTexInfo);
    __GMM_ASSERT(GMM_IS_64KB_TILE(pTexInfo->Flags) || pTexInfo->Flags.Info.TiledYf);
    __GMM_ASSERT(
    (pTexInfo->Type == RESOURCE_2D) ||
    (pTexInfo->Type == RESOURCE_3D) ||
    (pTexInfo->Type == RESOURCE_CUBE));
    __GMM_ASSERT(GmmIsPlanar(pTexInfo->Format) == false); // Planar not support

    if(pReqInfo->StdLayout.Offset == -1) // Special Req for Surface Size
    {
        NeedSurfaceSize = true;
        ReqArrayIndex   = // TODO(Medium): Add planar support.
        (pTexInfo->ArraySize * ((pTexInfo->Type == RESOURCE_CUBE) ? 6 : 1));
    }
    else
    {
        ReqArrayIndex =
        (pReqInfo->ArrayIndex * ((pTexInfo->Type == RESOURCE_CUBE) ? 6 : 1));
    }

    {
        uint32_t TileSize = 0;

        // TileYs (64) and TileYf (4)
        if(GMM_IS_64KB_TILE(pTexInfo->Flags))
        {
            TileSize = GMM_KBYTE(64);
        }
        else if(GMM_IS_4KB_TILE(pTexInfo->Flags))
        {
            TileSize = GMM_KBYTE(4);
        }

        const GMM_PLATFORM_INFO *pPlatform       = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);
        uint32_t                 BytesPerElement = pTexInfo->BitsPerPixel / CHAR_BIT;
        GMM_TILE_MODE            TileMode        = pTexInfo->TileMode;
        struct
        {
            uint32_t Width, Height, Depth;
        } Element, Tile;

        __GMM_ASSERT(TileMode < GMM_TILE_MODES);

        GetCompressionBlockDimensions(
        pTexInfo->Format,
        &Element.Width,
        &Element.Height,
        &Element.Depth);

        Tile.Width =
        (pPlatform->TileInfo[TileMode].LogicalTileWidth / BytesPerElement) *
        Element.Width;

        Tile.Height =
        pPlatform->TileInfo[TileMode].LogicalTileHeight *
        Element.Height;

        Tile.Depth =
        pPlatform->TileInfo[TileMode].LogicalTileDepth *
        Element.Depth;

        {
            GMM_GFX_ADDRESS TargetLodOffset = 0;
            GMM_GFX_SIZE_T  PrevMipSize     = 0;
            GMM_GFX_SIZE_T  SliceOffset     = 0;
            GMM_GFX_SIZE_T  SlicePitch      = 0;
            uint32_t        Lod;
            uint32_t        EffectiveMaxLod =
            (ReqArrayIndex == 0) ?
            pReqInfo->MipLevel :
            GFX_MIN(pTexInfo->MaxLod, pTexInfo->Alignment.MipTailStartLod);

            pReqInfo->StdLayout.Offset = 0;
            for(Lod = 0; Lod <= EffectiveMaxLod; Lod++)
            {
                GMM_GFX_SIZE_T MipWidth  = GmmTexGetMipWidth(pTexInfo, Lod);
                uint32_t       MipHeight = GmmTexGetMipHeight(pTexInfo, Lod);
                uint32_t       MipDepth  = GmmTexGetMipDepth(pTexInfo, Lod);

                uint32_t MipCols = GFX_ULONG_CAST(
                GFX_CEIL_DIV(
                MipWidth,
                Tile.Width));
                uint32_t MipRows =
                GFX_CEIL_DIV(
                MipHeight,
                Tile.Height);
                uint32_t MipDepthTiles =
                GFX_CEIL_DIV(
                MipDepth,
                Tile.Depth);
                uint32_t RowPitch   = MipCols * TileSize; // Bytes from one tile row to the next.
                uint32_t DepthPitch = RowPitch * MipRows; // Bytes from one depth slice of tiles to the next.

                if(Lod <= pTexInfo->Alignment.MipTailStartLod)
                {
                    pReqInfo->StdLayout.Offset += PrevMipSize;
                }

                if(Lod == pReqInfo->MipLevel)
                {
                    TargetLodOffset = pReqInfo->StdLayout.Offset;

                    pReqInfo->StdLayout.TileRowPitch   = RowPitch;
                    pReqInfo->StdLayout.TileDepthPitch = DepthPitch;
                }

                PrevMipSize = (GMM_GFX_SIZE_T)DepthPitch * MipDepthTiles;
                SlicePitch += DepthPitch;
            }

            if(pReqInfo->Slice > 0)
            {
                SliceOffset = SlicePitch * pReqInfo->Slice;
            }

            if(!NeedSurfaceSize && pReqInfo->MipLevel >= pTexInfo->Alignment.MipTailStartLod)
            {
                pReqInfo->StdLayout.Offset += (ReqArrayIndex * (pReqInfo->StdLayout.Offset + PrevMipSize)) +
                                              GetMipTailByteOffset(pTexInfo, pReqInfo->MipLevel);
            }
            else
            {
                pReqInfo->StdLayout.Offset = ReqArrayIndex * (pReqInfo->StdLayout.Offset + PrevMipSize) +
                                             TargetLodOffset;
            }

            pReqInfo->StdLayout.Offset += SliceOffset;
        }
    }

    return GMM_SUCCESS;
}